

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppwriteinitialization.cpp
# Opt level: O3

void __thiscall CPP::WriteInitialization::acceptLayout(WriteInitialization *this,DomLayout *node)

{
  QStack<DomLayout_*> *this_00;
  qsizetype *pqVar1;
  QArrayData *pQVar2;
  DomProperty **ppDVar3;
  long lVar4;
  Driver *this_01;
  char16_t *pcVar5;
  qsizetype qVar6;
  bool bVar7;
  bool bVar8;
  char cVar9;
  bool bVar10;
  Node<QString,_DomProperty_*> *pNVar11;
  QTextStream *pQVar12;
  iterator iVar13;
  iterator iVar14;
  iterator iVar15;
  iterator iVar16;
  DomProperty *pDVar17;
  int marginType;
  long lVar18;
  long in_FS_OFFSET;
  bool bVar19;
  QStringView QVar20;
  QStringView QVar21;
  QStringView QVar22;
  QStringView QVar23;
  QByteArrayView QVar24;
  QByteArrayView QVar25;
  QByteArrayView QVar26;
  QByteArrayView QVar27;
  QByteArrayView QVar28;
  QByteArrayView QVar29;
  QByteArrayView QVar30;
  QByteArrayView QVar31;
  QByteArrayView QVar32;
  QLatin1String QVar33;
  QLatin1String QVar34;
  QLatin1String QVar35;
  QLatin1String QVar36;
  DomProperty *p;
  DomPropertyMap properties;
  QString local_108;
  QString local_e8;
  QList<DomProperty_*> local_c8;
  QList<DomProperty_*> local_a8;
  DomPropertyMap local_90;
  QString local_88;
  QString local_70;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_70.d.d = (node->m_attr_class).d.d;
  local_70.d.ptr = (node->m_attr_class).d.ptr;
  local_70.d.size = (node->m_attr_class).d.size;
  if (&(local_70.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&((local_70.d.d)->super_QArrayData).ref_)->ref_)._q_value.
    super___atomic_base<int>._M_i =
         (((QArrayData *)&((local_70.d.d)->super_QArrayData).ref_)->ref_)._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_88.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_88.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_88.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  Driver::findOrInsertLayout(&local_88,this->m_driver,node);
  pQVar2 = &((node->m_property).d.d)->super_QArrayData;
  ppDVar3 = (node->m_property).d.ptr;
  lVar4 = (node->m_property).d.size;
  if (pQVar2 != (QArrayData *)0x0) {
    LOCK();
    (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_90.d = (Data<QHashPrivate::Node<QString,_DomProperty_*>_> *)0x0;
  if (lVar4 != 0) {
    lVar18 = 0;
    do {
      local_a8.d.d = *(Data **)((long)ppDVar3 + lVar18);
      local_58.d.d = *(Data **)&(local_a8.d.d)->super_QArrayData;
      local_58.d.ptr = (char16_t *)((local_a8.d.d)->super_QArrayData).alloc;
      local_58.d.size._0_4_ = local_a8.d.d[1].super_QArrayData.ref_;
      local_58.d.size._4_4_ = local_a8.d.d[1].super_QArrayData.flags;
      if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      QHash<QString,DomProperty*>::emplace<DomProperty*const&>
                ((QHash<QString,DomProperty*> *)&local_90,&local_58,(DomProperty **)&local_a8);
      if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
        }
      }
      lVar18 = lVar18 + 8;
    } while (lVar4 << 3 != lVar18);
  }
  if (pQVar2 != (QArrayData *)0x0) {
    LOCK();
    (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar2,8,0x10);
    }
  }
  local_58.d.d = (Data *)&DAT_00000006;
  local_58.d.ptr = L"margin";
  bVar19 = true;
  if ((local_90.d != (Data<QHashPrivate::Node<QString,_DomProperty_*>_> *)0x0) &&
     (pNVar11 = QHashPrivate::Data<QHashPrivate::Node<QString,_DomProperty_*>_>::
                findNode<QLatin1String>(local_90.d,(QLatin1String *)&local_58),
     pNVar11 != (Node<QString,_DomProperty_*> *)0x0)) {
    bVar19 = pNVar11->value == (DomProperty *)0x0;
  }
  pQVar12 = (QTextStream *)QTextStream::operator<<(this->m_output,&this->m_indent);
  pQVar12 = (QTextStream *)QTextStream::operator<<(pQVar12,&local_88);
  pQVar12 = (QTextStream *)QTextStream::operator<<(pQVar12," = ");
  pQVar12 = (QTextStream *)QTextStream::operator<<(pQVar12,(QString *)&language::operatorNew);
  pQVar12 = (QTextStream *)QTextStream::operator<<(pQVar12,&local_70);
  QTextStream::operator<<(pQVar12,'(');
  this_00 = &this->m_layoutChain;
  iVar13 = QList<DomLayout_*>::end(&this_00->super_QList<DomLayout_*>);
  if (iVar13.i[-1] == (DomLayout *)0x0) {
    pQVar12 = this->m_output;
    this_01 = this->m_driver;
    iVar14 = QList<DomWidget_*>::end(&(this->m_widgetChain).super_QList<DomWidget_*>);
    Driver::findOrInsertWidget(&local_58,this_01,iVar14.i[-1]);
    QTextStream::operator<<(pQVar12,&local_58);
    if ((DomProperty *)local_58.d.d != (DomProperty *)0x0) {
      LOCK();
      *(int *)&(((QString *)&(local_58.d.d)->super_QArrayData)->d).d =
           *(int *)&(((QString *)&(local_58.d.d)->super_QArrayData)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)&(local_58.d.d)->super_QArrayData)->d).d == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  pQVar12 = (QTextStream *)QTextStream::operator<<(this->m_output,")");
  QTextStream::operator<<(pQVar12,(QString *)&language::eol);
  iVar13 = QList<DomLayout_*>::end(&this_00->super_QList<DomLayout_*>);
  marginType = 0;
  if (!bVar19) {
    marginType = this->m_layoutMarginType;
  }
  LayoutDefaultHandler::writeProperties
            (&this->m_LayoutDefaultHandler,&this->m_indent,&local_88,&local_90,marginType,
             iVar13.i[-1] != (DomLayout *)0x0,this->m_output);
  this->m_layoutMarginType = 3;
  local_a8.d.d = (node->m_property).d.d;
  local_a8.d.ptr = (node->m_property).d.ptr;
  local_a8.d.size = (node->m_property).d.size;
  if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&((local_a8.d.d)->super_QArrayData).ref_)->ref_)._q_value.
    super___atomic_base<int>._M_i =
         (((QArrayData *)&((local_a8.d.d)->super_QArrayData).ref_)->ref_)._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_c8.d.d = (Data *)0x0;
  local_c8.d.ptr = (DomProperty **)0x0;
  local_c8.d.size = 0;
  if (this->m_layoutWidget != true) goto LAB_0012a6a5;
  iVar15 = QList<DomProperty_*>::begin(&local_a8);
  iVar16 = QList<DomProperty_*>::end(&local_a8);
  if (iVar15.i == iVar16.i) {
    bVar7 = false;
    bVar8 = false;
    bVar19 = false;
LAB_0012a3a0:
    pDVar17 = (DomProperty *)operator_new(0x178);
    memset(pDVar17,0,0x178);
    QVar24.m_data = (storage_type *)0xa;
    QVar24.m_size = (qsizetype)&local_58;
    QString::fromLatin1(QVar24);
    local_e8.d.d = local_58.d.d;
    local_e8.d.ptr = local_58.d.ptr;
    local_e8.d.size = local_58.d.size;
    QString::operator=((QString *)pDVar17,&local_e8);
    pDVar17->m_has_attr_name = true;
    if ((DomProperty *)local_e8.d.d != (DomProperty *)0x0) {
      LOCK();
      *(int *)&(((QString *)&(local_e8.d.d)->super_QArrayData)->d).d =
           *(int *)&(((QString *)&(local_e8.d.d)->super_QArrayData)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)&(local_e8.d.d)->super_QArrayData)->d).d == 0) {
        QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,2,0x10);
      }
    }
    DomProperty::setElementNumber(pDVar17,0);
    local_58.d.d = (Data *)pDVar17;
    QtPrivate::QPodArrayOps<DomProperty*>::emplace<DomProperty*&>
              ((QPodArrayOps<DomProperty*> *)&local_c8,local_c8.d.size,(DomProperty **)&local_58);
    QList<DomProperty_*>::end(&local_c8);
  }
  else {
    bVar10 = false;
    bVar7 = false;
    bVar8 = false;
    bVar19 = false;
    do {
      pDVar17 = *iVar15.i;
      pQVar2 = &((pDVar17->m_attr_name).d.d)->super_QArrayData;
      pcVar5 = (pDVar17->m_attr_name).d.ptr;
      qVar6 = (pDVar17->m_attr_name).d.size;
      if (pQVar2 != (QArrayData *)0x0) {
        LOCK();
        (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      switch(qVar6) {
      case 9:
        QVar20.m_data = pcVar5;
        QVar20.m_size = 9;
        QVar33.m_data = "topMargin";
        QVar33.m_size = 9;
        cVar9 = QtPrivate::equalStrings(QVar20,QVar33);
        if ((cVar9 != '\0') && (pDVar17->m_kind == Number)) {
          bVar7 = true;
        }
        break;
      case 10:
        QVar23.m_data = pcVar5;
        QVar23.m_size = 10;
        QVar36.m_data = "leftMargin";
        QVar36.m_size = 10;
        cVar9 = QtPrivate::equalStrings(QVar23,QVar36);
        if ((cVar9 != '\0') && (pDVar17->m_kind == Number)) {
          bVar10 = true;
        }
        break;
      case 0xb:
        QVar21.m_data = pcVar5;
        QVar21.m_size = 0xb;
        QVar34.m_data = "rightMargin";
        QVar34.m_size = 0xb;
        cVar9 = QtPrivate::equalStrings(QVar21,QVar34);
        if ((cVar9 != '\0') && (pDVar17->m_kind == Number)) {
          bVar8 = true;
        }
        break;
      case 0xc:
        QVar22.m_data = pcVar5;
        QVar22.m_size = 0xc;
        QVar35.m_data = "bottomMargin";
        QVar35.m_size = 0xc;
        cVar9 = QtPrivate::equalStrings(QVar22,QVar35);
        if (cVar9 != '\0') {
          bVar19 = (bool)(bVar19 | pDVar17->m_kind == Number);
        }
      }
      if (pQVar2 != (QArrayData *)0x0) {
        LOCK();
        (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar2,2,0x10);
        }
      }
      iVar15.i = iVar15.i + 1;
    } while (iVar15.i != iVar16.i);
    if (!bVar10) goto LAB_0012a3a0;
  }
  if (!bVar7) {
    pDVar17 = (DomProperty *)operator_new(0x178);
    memset(pDVar17,0,0x178);
    QVar25.m_data = (storage_type *)0x9;
    QVar25.m_size = (qsizetype)&local_58;
    QString::fromLatin1(QVar25);
    local_e8.d.d = local_58.d.d;
    local_e8.d.ptr = local_58.d.ptr;
    local_e8.d.size = local_58.d.size;
    QString::operator=((QString *)pDVar17,&local_e8);
    pDVar17->m_has_attr_name = true;
    if ((DomProperty *)local_e8.d.d != (DomProperty *)0x0) {
      LOCK();
      *(int *)&(((QString *)&(local_e8.d.d)->super_QArrayData)->d).d =
           *(int *)&(((QString *)&(local_e8.d.d)->super_QArrayData)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)&(local_e8.d.d)->super_QArrayData)->d).d == 0) {
        QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,2,0x10);
      }
    }
    DomProperty::setElementNumber(pDVar17,0);
    local_58.d.d = (Data *)pDVar17;
    QtPrivate::QPodArrayOps<DomProperty*>::emplace<DomProperty*&>
              ((QPodArrayOps<DomProperty*> *)&local_c8,local_c8.d.size,(DomProperty **)&local_58);
    QList<DomProperty_*>::end(&local_c8);
  }
  if (!bVar8) {
    pDVar17 = (DomProperty *)operator_new(0x178);
    memset(pDVar17,0,0x178);
    QVar26.m_data = (storage_type *)0xb;
    QVar26.m_size = (qsizetype)&local_58;
    QString::fromLatin1(QVar26);
    local_e8.d.d = local_58.d.d;
    local_e8.d.ptr = local_58.d.ptr;
    local_e8.d.size = local_58.d.size;
    QString::operator=((QString *)pDVar17,&local_e8);
    pDVar17->m_has_attr_name = true;
    if ((DomProperty *)local_e8.d.d != (DomProperty *)0x0) {
      LOCK();
      *(int *)&(((QString *)&(local_e8.d.d)->super_QArrayData)->d).d =
           *(int *)&(((QString *)&(local_e8.d.d)->super_QArrayData)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)&(local_e8.d.d)->super_QArrayData)->d).d == 0) {
        QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,2,0x10);
      }
    }
    DomProperty::setElementNumber(pDVar17,0);
    local_58.d.d = (Data *)pDVar17;
    QtPrivate::QPodArrayOps<DomProperty*>::emplace<DomProperty*&>
              ((QPodArrayOps<DomProperty*> *)&local_c8,local_c8.d.size,(DomProperty **)&local_58);
    QList<DomProperty_*>::end(&local_c8);
  }
  if (!bVar19) {
    pDVar17 = (DomProperty *)operator_new(0x178);
    memset(pDVar17,0,0x178);
    QVar27.m_data = (storage_type *)0xc;
    QVar27.m_size = (qsizetype)&local_58;
    QString::fromLatin1(QVar27);
    local_e8.d.d = local_58.d.d;
    local_e8.d.ptr = local_58.d.ptr;
    local_e8.d.size = local_58.d.size;
    QString::operator=((QString *)pDVar17,&local_e8);
    pDVar17->m_has_attr_name = true;
    if ((DomProperty *)local_e8.d.d != (DomProperty *)0x0) {
      LOCK();
      *(int *)&(((QString *)&(local_e8.d.d)->super_QArrayData)->d).d =
           *(int *)&(((QString *)&(local_e8.d.d)->super_QArrayData)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)&(local_e8.d.d)->super_QArrayData)->d).d == 0) {
        QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,2,0x10);
      }
    }
    DomProperty::setElementNumber(pDVar17,0);
    local_58.d.d = (Data *)pDVar17;
    QtPrivate::QPodArrayOps<DomProperty*>::emplace<DomProperty*&>
              ((QPodArrayOps<DomProperty*> *)&local_c8,local_c8.d.size,(DomProperty **)&local_58);
    QList<DomProperty_*>::end(&local_c8);
  }
  this->m_layoutWidget = false;
LAB_0012a6a5:
  QtPrivate::QCommonArrayOps<DomProperty_*>::growAppend
            ((QCommonArrayOps<DomProperty_*> *)&local_a8,local_c8.d.ptr,
             local_c8.d.ptr + local_c8.d.size);
  writeProperties(this,&local_88,&local_70,&local_a8,3);
  QList<DomProperty_*>::clear(&local_a8);
  qDeleteAll<QList<DomProperty*>::const_iterator>
            ((const_iterator)local_c8.d.ptr,(const_iterator)(local_c8.d.ptr + local_c8.d.size));
  QList<DomProperty_*>::clear(&local_c8);
  local_58.d.d = (Data *)node;
  QtPrivate::QPodArrayOps<DomLayout*>::emplace<DomLayout*&>
            ((QPodArrayOps<DomLayout*> *)this_00,
             (this->m_layoutChain).super_QList<DomLayout_*>.d.size,(DomLayout **)&local_58);
  QList<DomLayout_*>::end(&this_00->super_QList<DomLayout_*>);
  TreeWalker::acceptLayout(&this->super_TreeWalker,node);
  QList<DomLayout_*>::end(&this_00->super_QList<DomLayout_*>);
  pqVar1 = &(this->m_layoutChain).super_QList<DomLayout_*>.d.size;
  *pqVar1 = *pqVar1 + -1;
  local_e8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_e8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_e8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QString::QString(&local_e8,(QChar)0x30);
  QVar28.m_data = (storage_type *)0xa;
  QVar28.m_size = (qsizetype)&local_58;
  QString::fromLatin1(QVar28);
  local_108.d.d = local_58.d.d;
  local_108.d.ptr = local_58.d.ptr;
  local_108.d.size = local_58.d.size;
  pQVar2 = &((node->m_attr_stretch).d.d)->super_QArrayData;
  local_58.d.ptr = (node->m_attr_stretch).d.ptr;
  local_58.d.size = (node->m_attr_stretch).d.size;
  local_58.d.d = (Data *)pQVar2;
  if (pQVar2 == (QArrayData *)0x0) {
    writePropertyList(this,&local_88,&local_108,&local_58,&local_e8);
  }
  else {
    LOCK();
    (((QArrayData *)&pQVar2->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
         (((QArrayData *)&pQVar2->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    writePropertyList(this,&local_88,&local_108,&local_58,&local_e8);
    if (pQVar2 != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&pQVar2->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)&pQVar2->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QArrayData *)&pQVar2->ref_)->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if ((DomLayout *)local_108.d.d != (DomLayout *)0x0) {
    LOCK();
    *(int *)&(((QString *)&(local_108.d.d)->super_QArrayData)->d).d =
         *(int *)&(((QString *)&(local_108.d.d)->super_QArrayData)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)&(local_108.d.d)->super_QArrayData)->d).d == 0) {
      QArrayData::deallocate(&(local_108.d.d)->super_QArrayData,2,0x10);
    }
  }
  QVar29.m_data = (storage_type *)0xd;
  QVar29.m_size = (qsizetype)&local_58;
  QString::fromLatin1(QVar29);
  local_108.d.d = local_58.d.d;
  local_108.d.ptr = local_58.d.ptr;
  local_108.d.size = local_58.d.size;
  pQVar2 = &((node->m_attr_rowStretch).d.d)->super_QArrayData;
  local_58.d.ptr = (node->m_attr_rowStretch).d.ptr;
  local_58.d.size = (node->m_attr_rowStretch).d.size;
  local_58.d.d = (Data *)pQVar2;
  if (pQVar2 == (QArrayData *)0x0) {
    writePropertyList(this,&local_88,&local_108,&local_58,&local_e8);
  }
  else {
    LOCK();
    (((QArrayData *)&pQVar2->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
         (((QArrayData *)&pQVar2->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    writePropertyList(this,&local_88,&local_108,&local_58,&local_e8);
    if (pQVar2 != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&pQVar2->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)&pQVar2->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QArrayData *)&pQVar2->ref_)->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (&(local_108.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_108.d.d)->super_QArrayData,2,0x10);
    }
  }
  QVar30.m_data = (storage_type *)0x10;
  QVar30.m_size = (qsizetype)&local_58;
  QString::fromLatin1(QVar30);
  local_108.d.d = local_58.d.d;
  local_108.d.ptr = local_58.d.ptr;
  local_108.d.size = local_58.d.size;
  pQVar2 = &((node->m_attr_columnStretch).d.d)->super_QArrayData;
  local_58.d.ptr = (node->m_attr_columnStretch).d.ptr;
  local_58.d.size = (node->m_attr_columnStretch).d.size;
  local_58.d.d = (Data *)pQVar2;
  if (pQVar2 == (QArrayData *)0x0) {
    writePropertyList(this,&local_88,&local_108,&local_58,&local_e8);
  }
  else {
    LOCK();
    (((QArrayData *)&pQVar2->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
         (((QArrayData *)&pQVar2->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    writePropertyList(this,&local_88,&local_108,&local_58,&local_e8);
    if (pQVar2 != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&pQVar2->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)&pQVar2->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QArrayData *)&pQVar2->ref_)->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (&(local_108.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_108.d.d)->super_QArrayData,2,0x10);
    }
  }
  QVar31.m_data = (storage_type *)0x15;
  QVar31.m_size = (qsizetype)&local_58;
  QString::fromLatin1(QVar31);
  local_108.d.d = local_58.d.d;
  local_108.d.ptr = local_58.d.ptr;
  local_108.d.size = local_58.d.size;
  pQVar2 = &((node->m_attr_columnMinimumWidth).d.d)->super_QArrayData;
  local_58.d.ptr = (node->m_attr_columnMinimumWidth).d.ptr;
  local_58.d.size = (node->m_attr_columnMinimumWidth).d.size;
  local_58.d.d = (Data *)pQVar2;
  if (pQVar2 == (QArrayData *)0x0) {
    writePropertyList(this,&local_88,&local_108,&local_58,&local_e8);
  }
  else {
    LOCK();
    (((QArrayData *)&pQVar2->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
         (((QArrayData *)&pQVar2->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    writePropertyList(this,&local_88,&local_108,&local_58,&local_e8);
    if (pQVar2 != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&pQVar2->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)&pQVar2->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QArrayData *)&pQVar2->ref_)->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (&(local_108.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_108.d.d)->super_QArrayData,2,0x10);
    }
  }
  QVar32.m_data = (storage_type *)0x13;
  QVar32.m_size = (qsizetype)&local_58;
  QString::fromLatin1(QVar32);
  local_108.d.d = local_58.d.d;
  local_108.d.ptr = local_58.d.ptr;
  local_108.d.size = local_58.d.size;
  pQVar2 = &((node->m_attr_rowMinimumHeight).d.d)->super_QArrayData;
  local_58.d.ptr = (node->m_attr_rowMinimumHeight).d.ptr;
  local_58.d.size = (node->m_attr_rowMinimumHeight).d.size;
  local_58.d.d = (Data *)pQVar2;
  if (pQVar2 == (QArrayData *)0x0) {
    writePropertyList(this,&local_88,&local_108,&local_58,&local_e8);
  }
  else {
    LOCK();
    (((QArrayData *)&pQVar2->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
         (((QArrayData *)&pQVar2->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    writePropertyList(this,&local_88,&local_108,&local_58,&local_e8);
    if (pQVar2 != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&pQVar2->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)&pQVar2->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QArrayData *)&pQVar2->ref_)->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (&(local_108.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_108.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_c8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_c8.d.d)->super_QArrayData,8,0x10);
    }
  }
  if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,8,0x10);
    }
  }
  QHash<QString,_DomProperty_*>::~QHash(&local_90);
  if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_70.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_70.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void WriteInitialization::acceptLayout(DomLayout *node)
{
    const QString className = node->attributeClass();
    const QString varName = m_driver->findOrInsertLayout(node);

    const DomPropertyMap properties = propertyMap(node->elementProperty());
    const bool oldLayoutProperties = properties.value("margin"_L1) != nullptr;

    bool isGroupBox = false;

    m_output << m_indent << varName << " = " << language::operatorNew << className << '(';

    if (!m_layoutChain.top() && !isGroupBox)
        m_output << m_driver->findOrInsertWidget(m_widgetChain.top());

    m_output << ")" << language::eol;

    // Suppress margin on a read child layout
    const bool suppressMarginDefault = m_layoutChain.top();
    int marginType = Use43UiFile;
    if (oldLayoutProperties)
        marginType = m_layoutMarginType;
    m_LayoutDefaultHandler.writeProperties(m_indent, varName, properties, marginType, suppressMarginDefault, m_output);

    m_layoutMarginType = SubLayoutMargin;

    DomPropertyList propList = node->elementProperty();
    DomPropertyList newPropList;
    if (m_layoutWidget) {
        bool left = false;
        bool top = false;
        bool right = false;
        bool bottom = false;
        for (const DomProperty *p : propList) {
            const QString propertyName = p->attributeName();
            if (propertyName == "leftMargin"_L1 && p->kind() == DomProperty::Number)
                left = true;
            else if (propertyName == "topMargin"_L1 && p->kind() == DomProperty::Number)
                top = true;
            else if (propertyName == "rightMargin"_L1 && p->kind() == DomProperty::Number)
                right = true;
            else if (propertyName == "bottomMargin"_L1 && p->kind() == DomProperty::Number)
                bottom = true;
        }
        if (!left) {
            auto *p = new DomProperty();
            p->setAttributeName("leftMargin"_L1);
            p->setElementNumber(0);
            newPropList.append(p);
        }
        if (!top) {
            auto *p = new DomProperty();
            p->setAttributeName("topMargin"_L1);
            p->setElementNumber(0);
            newPropList.append(p);
        }
        if (!right) {
            auto *p = new DomProperty();
            p->setAttributeName("rightMargin"_L1);
            p->setElementNumber(0);
            newPropList.append(p);
        }
        if (!bottom) {
            auto *p = new DomProperty();
            p->setAttributeName("bottomMargin"_L1);
            p->setElementNumber(0);
            newPropList.append(p);
        }
        m_layoutWidget = false;
    }

    propList.append(newPropList);

    writeProperties(varName, className, propList, WritePropertyIgnoreMargin|WritePropertyIgnoreSpacing);

    // Clean up again:
    propList.clear();
    qDeleteAll(newPropList);
    newPropList.clear();

    m_layoutChain.push(node);
    TreeWalker::acceptLayout(node);
    m_layoutChain.pop();

    // Stretch? (Unless we are compiling for UIC3)
    const QString numberNull(u'0');
    writePropertyList(varName, "setStretch"_L1, node->attributeStretch(), numberNull);
    writePropertyList(varName, "setRowStretch"_L1, node->attributeRowStretch(), numberNull);
    writePropertyList(varName, "setColumnStretch"_L1, node->attributeColumnStretch(), numberNull);
    writePropertyList(varName, "setColumnMinimumWidth"_L1, node->attributeColumnMinimumWidth(), numberNull);
    writePropertyList(varName, "setRowMinimumHeight"_L1, node->attributeRowMinimumHeight(), numberNull);
}